

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetLogFile(HelicsFederate fed,char *logFile,HelicsError *err)

{
  bool bVar1;
  Federate *this;
  __shared_ptr *this_00;
  element_type *peVar2;
  HelicsError *in_RDX;
  long in_RSI;
  __sv_type _Var3;
  shared_ptr<helics::Core> *corePtr;
  Federate *fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  HelicsError *in_stack_ffffffffffffff88;
  HelicsFederate in_stack_ffffffffffffff90;
  bool local_5a;
  allocator<char> local_59 [9];
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_t local_38;
  char *local_30;
  
  this = getFed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (this != (Federate *)0x0) {
    this_00 = (__shared_ptr *)helics::Federate::getCorePointer(this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1be979);
      if (in_RSI == 0) {
        std::__cxx11::string::string
                  (in_stack_ffffffffffffffc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffffb8);
      }
      else {
        in_stack_ffffffffffffff80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0);
      }
      local_5a = in_RSI != 0;
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
      local_38 = _Var3._M_len;
      local_30 = _Var3._M_str;
      (*peVar2->_vptr_Core[0x59])(peVar2,local_38,local_30);
      std::__cxx11::string::~string(in_stack_ffffffffffffff80);
      if (local_5a) {
        std::allocator<char>::~allocator(local_59);
      }
    }
    else {
      assignError(in_RDX,-10,"Federate core is not connected");
    }
  }
  return;
}

Assistant:

void helicsFederateSetLogFile(HelicsFederate fed, const char* logFile, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    const auto& corePtr = fedObj->getCorePointer();

    try {
        if (corePtr) {
            corePtr->setLogFile(AS_STRING(logFile));
            // LCOV_EXCL_START
        } else {  // this can theoretically happen but it would be pretty odd
            assignError(err, HELICS_ERROR_INVALID_FUNCTION_CALL, invalidFederateCore);
            return;
            // LCOV_EXCL_STOP
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}